

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  UCPTrie *trie;
  void *pvVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  UBool UVar7;
  int iVar8;
  UChar *pUVar9;
  long lVar10;
  byte bVar11;
  ushort uVar12;
  ushort norm16;
  uint c;
  UChar *pUVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  UChar *local_50;
  
  UVar1 = this->minDecompNoCP;
  if (limit == (UChar *)0x0) {
    lVar6 = 0;
    do {
      lVar10 = lVar6;
      if (*(UChar *)((long)src + lVar10) == L'\0') break;
      lVar6 = lVar10 + 2;
    } while ((ushort)*(UChar *)((long)src + lVar10) < (ushort)UVar1);
    pUVar13 = (UChar *)((long)src + lVar10);
    if (buffer != (ReorderingBuffer *)0x0 && lVar10 + 2 != 2) {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar13,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return pUVar13;
    }
    limit = u_strchr_63(pUVar13,L'\0');
    src = pUVar13;
  }
  c = 0;
  norm16 = 0;
  uVar5 = 0;
  pUVar13 = src;
  local_50 = src;
joined_r0x00296ab3:
  if (pUVar13 != limit) {
    UVar2 = *pUVar13;
    c = (uint)(ushort)UVar2;
    if ((ushort)UVar1 <= (ushort)UVar2) {
      trie = this->normTrie;
      pvVar3 = (trie->data).ptr0;
      norm16 = *(ushort *)
                ((long)pvVar3 +
                (ulong)(((ushort)UVar2 & 0x3f) + (uint)trie->index[(ushort)UVar2 >> 6]) * 2);
      if (((norm16 & 0xfdff) != 0xfc00) && (this->minYesNo <= norm16)) {
        if (((ushort)UVar2 & 0xfc00) != 0xd800) goto LAB_00296bc3;
        pUVar9 = pUVar13 + 1;
        bVar14 = true;
        if ((pUVar9 != limit) && (((ushort)*pUVar9 & 0xfc00) == 0xdc00)) {
          c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar9 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar8 = ucptrie_internalSmallIndex_63(trie,c);
          }
          else {
            iVar8 = trie->dataLength + -2;
          }
          norm16 = *(ushort *)((long)pvVar3 + (long)iVar8 * 2);
          bVar14 = (norm16 & 0xfdff) == 0xfc00 || norm16 < this->minYesNo;
          pUVar9 = pUVar13 + (ulong)bVar14 * 2;
        }
        pUVar13 = pUVar9;
        if (bVar14) goto joined_r0x00296ab3;
        goto LAB_00296bc3;
      }
    }
    pUVar13 = pUVar13 + 1;
    goto joined_r0x00296ab3;
  }
LAB_00296bc3:
  bVar14 = pUVar13 == src;
  pUVar9 = pUVar13;
  if (bVar14) {
    pUVar9 = local_50;
  }
  uVar12 = uVar5 & 0xff;
  if (!bVar14) {
    uVar12 = 0;
  }
  if ((!bVar14 && buffer != (ReorderingBuffer *)0x0) &&
     (UVar7 = ReorderingBuffer::appendZeroCC(buffer,src,pUVar13,errorCode), pUVar9 = local_50,
     uVar12 = uVar5, UVar7 == '\0')) {
    return pUVar13;
  }
  local_50 = pUVar9;
  if (pUVar13 == limit) {
    return pUVar13;
  }
  src = pUVar13 + (2 - (c < 0x10000));
  if (buffer == (ReorderingBuffer *)0x0) {
    if ((this->minYesNo <= norm16) && (norm16 < this->minMaybeYes)) {
      return local_50;
    }
    uVar4 = norm16 >> 1;
    if (norm16 < 0xfc00) {
      uVar4 = 0;
    }
    bVar11 = (byte)uVar4;
    bVar14 = bVar11 < (byte)uVar12;
    bVar16 = bVar11 != 0;
    pUVar13 = local_50;
    if (!bVar16 || !bVar14) {
      pUVar13 = src;
    }
    pUVar9 = local_50;
    if (bVar11 < 2) {
      pUVar9 = pUVar13;
    }
    bVar15 = bVar16 && bVar14;
    local_50 = pUVar9;
    uVar5 = uVar12 & 0xff;
    if (!bVar16 || !bVar14) {
      uVar5 = uVar4;
    }
  }
  else {
    UVar7 = decompose(this,c,norm16,buffer,errorCode);
    bVar15 = UVar7 == '\0';
    pUVar9 = src;
    uVar5 = uVar12;
  }
  pUVar13 = src;
  if (bVar15) {
    return pUVar9;
  }
  goto joined_r0x00296ab3;
}

Assistant:

const UChar *
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           ReorderingBuffer *buffer,
                           UErrorCode &errorCode) const {
    UChar32 minNoCP=minDecompNoCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        limit=u_strchr(src, 0);
    }

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t norm16=0;

    // only for quick check
    const UChar *prevBoundary=src;
    uint8_t prevCC=0;

    for(;;) {
        // count code units below the minimum or with irrelevant data for the quick check
        for(prevSrc=src; src!=limit;) {
            if( (c=*src)<minNoCP ||
                isMostDecompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else if(!U16_IS_LEAD(c)) {
                break;
            } else {
                UChar c2;
                if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                    if(isMostDecompYesAndZeroCC(norm16)) {
                        src+=2;
                    } else {
                        break;
                    }
                } else {
                    ++src;  // unpaired lead surrogate: inert
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL) {
                if(!buffer->appendZeroCC(prevSrc, src, errorCode)) {
                    break;
                }
            } else {
                prevCC=0;
                prevBoundary=src;
            }
        }
        if(src==limit) {
            break;
        }

        // Check one above-minimum, relevant code point.
        src+=U16_LENGTH(c);
        if(buffer!=NULL) {
            if(!decompose(c, norm16, *buffer, errorCode)) {
                break;
            }
        } else {
            if(isDecompYes(norm16)) {
                uint8_t cc=getCCFromYesOrMaybe(norm16);
                if(prevCC<=cc || cc==0) {
                    prevCC=cc;
                    if(cc<=1) {
                        prevBoundary=src;
                    }
                    continue;
                }
            }
            return prevBoundary;  // "no" or cc out of order
        }
    }
    return src;
}